

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int wait_ms(int timeout_ms)

{
  int *piVar1;
  time_t tVar2;
  timeval older;
  timeval newer;
  int local_2c;
  int r;
  int error;
  int pending_ms;
  timeval initial_tv;
  int timeout_ms_local;
  
  if (timeout_ms == 0) {
    initial_tv.tv_usec._4_4_ = 0;
  }
  else if (timeout_ms < 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    initial_tv.tv_usec._4_4_ = -1;
  }
  else {
    older = curlx_tvnow();
    r = timeout_ms;
    do {
      local_2c = poll((pollfd *)0x0,0,r);
      if (local_2c != -1) break;
      piVar1 = __errno_location();
      if ((*piVar1 != 0) && (*piVar1 != 4)) break;
      newer = curlx_tvnow();
      tVar2 = curlx_tvdiff(newer,older);
      r = timeout_ms - (int)tVar2;
    } while (0 < r);
    if (local_2c != 0) {
      local_2c = -1;
    }
    initial_tv.tv_usec._4_4_ = local_2c;
  }
  return initial_tv.tv_usec._4_4_;
}

Assistant:

int wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct timeval initial_tv;
  int pending_ms;
  int error;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    errno = EINVAL;
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = curlx_tvnow();
  do {
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = errno;
    if(error && (error != EINTR))
      break;
    pending_ms = timeout_ms - (int)curlx_tvdiff(curlx_tvnow(), initial_tv);
    if(pending_ms <= 0)
      break;
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}